

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O0

uint32_t __thiscall
ddd::DictionaryMLT<true,_true>::delete_key(DictionaryMLT<false,_false> *this,char *key)

{
  bool bVar1;
  uint32_t node_pos;
  uint32_t uVar2;
  ulong uVar3;
  size_type sVar4;
  char *in_RSI;
  long in_RDI;
  Query *in_stack_00000010;
  DaTrie<true,_true,_false> *in_stack_00000018;
  uint32_t suffix_id;
  uint32_t leaf_pos;
  Query query;
  pointer in_stack_ffffffffffffff78;
  unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
  *in_stack_ffffffffffffff80;
  Query *in_stack_ffffffffffffff88;
  Query *this_00;
  DaTrie<true,_true,_true> *in_stack_ffffffffffffff90;
  DaTrie<true,_true,_true> *this_01;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  uint32_t local_4;
  
  Query::Query((Query *)&stack0xffffffffffffffd0,in_RSI);
  std::
  unique_ptr<ddd::DaTrie<true,_true,_true>,_std::default_delete<ddd::DaTrie<true,_true,_true>_>_>::
  operator->((unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
              *)0x17b67d);
  bVar1 = DaTrie<true,_true,_true>::search_prefix
                    ((DaTrie<true,_true,_true> *)
                     CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),
                     (Query *)in_stack_ffffffffffffff90);
  if (bVar1) {
    bVar1 = Query::is_finished((Query *)&stack0xffffffffffffffd0);
    if (bVar1) {
      std::
      unique_ptr<ddd::DaTrie<true,_true,_true>,_std::default_delete<ddd::DaTrie<true,_true,_true>_>_>
      ::operator->((unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                    *)0x17b6ed);
      DaTrie<true,_true,_true>::delete_prefix_leaf
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + -1;
      local_4 = Query::value((Query *)&stack0xffffffffffffffd0);
    }
    else {
      this_01 = (DaTrie<true,_true,_true> *)&stack0xffffffffffffffd0;
      node_pos = Query::node_pos((Query *)this_01);
      uVar2 = Query::value((Query *)this_01);
      Query::set_node_pos((Query *)this_01,0);
      std::
      vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
      ::operator[]((vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
                    *)(in_RDI + 0x10),(ulong)uVar2);
      std::
      unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
      ::operator->((unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
                    *)0x17b774);
      bVar1 = DaTrie<true,_true,_false>::delete_key(in_stack_00000018,in_stack_00000010);
      if (bVar1) {
        std::
        vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
        ::operator[]((vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
                      *)(in_RDI + 0x10),(ulong)uVar2);
        std::
        unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
        ::operator->((unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
                      *)0x17b7c5);
        bVar1 = DaTrie<true,_true,_false>::is_empty((DaTrie<true,_true,_false> *)0x17b7cd);
        if (bVar1) {
          this_00 = (Query *)&stack0xffffffffffffffd0;
          Query::set_node_pos(this_00,node_pos);
          std::
          unique_ptr<ddd::DaTrie<true,_true,_true>,_std::default_delete<ddd::DaTrie<true,_true,_true>_>_>
          ::operator->((unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                        *)0x17b7f7);
          DaTrie<true,_true,_true>::delete_prefix_leaf(this_01,this_00);
          std::
          vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
          ::operator[]((vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
                        *)(in_RDI + 0x10),(ulong)uVar2);
          std::
          unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>
          ::reset(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
          uVar3 = (ulong)(uVar2 + 1);
          sVar4 = std::
                  vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
                  ::size((vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
                          *)(in_RDI + 0x10));
          if (uVar3 == sVar4) {
            std::
            vector<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<true,_true,_false>,_std::default_delete<ddd::DaTrie<true,_true,_false>_>_>_>_>
            ::pop_back((vector<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
                        *)0x17b85d);
          }
          else if (uVar2 < *(uint *)(in_RDI + 0x28)) {
            *(uint32_t *)(in_RDI + 0x28) = uVar2;
          }
        }
        *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + -1;
        local_4 = Query::value((Query *)&stack0xffffffffffffffd0);
      }
      else {
        local_4 = 0xffffffff;
      }
    }
  }
  else {
    local_4 = 0xffffffff;
  }
  Query::~Query((Query *)&stack0xffffffffffffffd0);
  return local_4;
}

Assistant:

uint32_t delete_key(const char* key) {
    Query query(key);

    if (!prefix_subtrie_->search_prefix(query)) {
      return NOT_FOUND;
    }

    if (query.is_finished()) {
      prefix_subtrie_->delete_prefix_leaf(query);
      --num_keys_;
      return query.value();
    }

    auto leaf_pos = query.node_pos();
    auto suffix_id = query.value();

    query.set_node_pos(ROOT_POS);
    if (!suffix_subtries_[suffix_id]->delete_key(query)) {
      return NOT_FOUND;
    }

    if (suffix_subtries_[suffix_id]->is_empty()) { // update suffix link
      query.set_node_pos(leaf_pos);
      prefix_subtrie_->delete_prefix_leaf(query);
      suffix_subtries_[suffix_id].reset();

      if (suffix_id + 1 == suffix_subtries_.size()) {
        suffix_subtries_.pop_back();
      } else if (suffix_id < suffix_head_) {
        suffix_head_ = suffix_id;
      }
    }

    --num_keys_;
    return query.value();
  }